

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O2

LY_ERR lys_compile_depset_all(ly_ctx *ctx,lys_glob_unres *unres)

{
  lyd_node *plVar1;
  long lVar2;
  LY_ERR LVar3;
  uint32_t i;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  do {
    if ((unres->dep_sets).count <= uVar5) {
      return LY_SUCCESS;
    }
    plVar1 = (unres->dep_sets).field_2.dnodes[uVar5];
    for (uVar4 = 0; uVar4 < plVar1->flags; uVar4 = uVar4 + 1) {
      lVar2 = *(long *)(plVar1->schema->hash + uVar4 * 8 + -4);
      if ((*(char *)(lVar2 + 0x79) != '\0') &&
         (LVar3 = lys_check_features(*(lysp_module **)(lVar2 + 0x50)), LVar3 != LY_SUCCESS)) {
        return LVar3;
      }
    }
    LVar3 = lys_compile_depset_r(ctx,(ly_set *)(unres->dep_sets).field_2.dnodes[uVar5],unres);
    uVar5 = uVar5 + 1;
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
  } while( true );
}

Assistant:

LY_ERR
lys_compile_depset_all(struct ly_ctx *ctx, struct lys_glob_unres *unres)
{
    uint32_t i;

    for (i = 0; i < unres->dep_sets.count; ++i) {
        LY_CHECK_RET(lys_compile_depset_check_features(unres->dep_sets.objs[i]));
        LY_CHECK_RET(lys_compile_depset_r(ctx, unres->dep_sets.objs[i], unres));
    }

    return LY_SUCCESS;
}